

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesPass::Process(RemoveUnusedInterfaceVariablesPass *this)

{
  Module *pMVar1;
  Instruction *entry_00;
  bool bVar2;
  Status SVar3;
  Instruction *entry;
  Instruction **ppIVar4;
  RemoveUnusedInterfaceVariablesContext context;
  RemoveUnusedInterfaceVariablesContext RStack_a8;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  SVar3 = Failure;
  ppIVar4 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (entry_00 = *ppIVar4,
        entry_00 !=
        (Instruction *)
        ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    RemoveUnusedInterfaceVariablesContext::RemoveUnusedInterfaceVariablesContext
              (&RStack_a8,this,entry_00);
    RemoveUnusedInterfaceVariablesContext::CollectUsedVariables(&RStack_a8);
    bVar2 = RemoveUnusedInterfaceVariablesContext::ShouldModify(&RStack_a8);
    if (bVar2) {
      RemoveUnusedInterfaceVariablesContext::Modify(&RStack_a8);
      SVar3 = 1;
    }
    RemoveUnusedInterfaceVariablesContext::~RemoveUnusedInterfaceVariablesContext(&RStack_a8);
    ppIVar4 = &(entry_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return SVar3 ^ SuccessWithoutChange;
}

Assistant:

RemoveUnusedInterfaceVariablesPass::Status
RemoveUnusedInterfaceVariablesPass::Process() {
  bool modified = false;
  for (auto& entry : get_module()->entry_points()) {
    RemoveUnusedInterfaceVariablesContext context(*this, entry);
    context.CollectUsedVariables();
    if (context.ShouldModify()) {
      context.Modify();
      modified = true;
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}